

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O3

TPZAutoPointer<TPZMatrix<float>_>
TPZAutoPointerDynamicCast<TPZMatrix<float>,TPZSavable>(TPZAutoPointer<TPZSavable> *in)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  long lVar3;
  long *in_RSI;
  
  pTVar2 = (TPZReference *)operator_new(0x10);
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar2->fPointer = (TPZSavable *)0x0;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  in->fRef = pTVar2;
  if (*(long *)*in_RSI != 0) {
    lVar3 = __dynamic_cast(*(long *)*in_RSI,&TPZSavable::typeinfo,&TPZMatrix<float>::typeinfo,0);
    if (lVar3 != 0) {
      operator_delete(pTVar2,0x10);
      pTVar2 = (TPZReference *)*in_RSI;
      in->fRef = pTVar2;
      LOCK();
      paVar1 = &pTVar2->fCounter;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
    }
  }
  return (TPZAutoPointer<TPZMatrix<float>_>)(TPZReference *)in;
}

Assistant:

TPZAutoPointer<R> TPZAutoPointerDynamicCast(TPZAutoPointer<T> in) {
    TPZAutoPointer<R> rv;
    if (R* p; (p = dynamic_cast<R*> (in.fRef->fPointer)) ) {
        delete rv.fRef;
        rv.fRef = (typename TPZAutoPointer<R>::TPZReference *) in.fRef;
        rv.fRef->Increment();
    }
    return rv;
}